

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

void __thiscall defyx::Instruction::h_FADD_M(Instruction *this,ostream *os)

{
  byte bVar1;
  byte bVar2;
  ostream *poVar3;
  
  bVar1 = this->dst;
  bVar2 = this->src;
  std::__ostream_insert<char,std::char_traits<char>>(os,"f",1);
  poVar3 = (ostream *)std::ostream::operator<<(os,bVar1 & 3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  genAddressReg(this,os,bVar2 & 7);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  return;
}

Assistant:

void Instruction::h_FADD_M(std::ostream& os) const {
		auto dstIndex = dst % RegisterCountFlt;
		auto srcIndex = src % RegistersCount;
		os << "f" << dstIndex << ", ";
		genAddressReg(os, srcIndex);
		os << std::endl;
	}